

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

int If_CutPerformCheck45(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  If_Par_t *pIVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  word Func0;
  ulong local_48;
  If_Grp_t R;
  If_Grp_t local_2a;
  
  If_CluCheck(&local_2a,p,(word *)pTruth,nLeaves,0,0,5,4,&R,&Func0,&local_48,(word *)0x0,0);
  if (local_2a.nVars == 0) {
    return 0;
  }
  uVar6 = (uint)R.nVars;
  if (uVar6 < 7) {
    if (R.nVars != '\x06') {
      bVar4 = (byte)(1 << (R.nVars & 0x1fU));
      uVar9 = Func0 & ~(-1L << (bVar4 & 0x3f));
      uVar5 = 0;
      uVar10 = uVar9 << (bVar4 & 0x3f);
      if (R.nVars != '\0') {
        uVar10 = uVar5;
      }
      uVar10 = uVar10 | uVar9;
      uVar9 = uVar10 * 4;
      if (1 < (byte)R.nVars) {
        uVar9 = uVar5;
      }
      uVar9 = uVar9 | uVar10;
      uVar8 = 2;
      if (2 < uVar6) {
        uVar8 = uVar6;
      }
      uVar10 = uVar9 << 4;
      if (2U < (byte)R.nVars) {
        uVar10 = uVar5;
      }
      uVar6 = 3;
      if (2U < (byte)R.nVars) {
        uVar6 = uVar8;
      }
      uVar10 = uVar10 | uVar9;
      uVar9 = uVar10 << 8;
      if (uVar6 != 3) {
        uVar9 = uVar5;
      }
      uVar9 = uVar9 | uVar10;
      uVar10 = uVar9 << 0x10;
      if (1 < uVar6 - 3) {
        uVar10 = uVar5;
      }
      uVar10 = uVar10 | uVar9;
      Func0 = uVar10 << 0x20 | uVar10;
    }
    if ((byte)local_2a.nVars < 7) {
      uVar10 = local_48;
      if (local_2a.nVars != 6) {
        local_48 = local_48 & ~(-1L << ((byte)(1 << (local_2a.nVars & 0x1fU)) & 0x3f));
        uVar5 = 0;
        uVar10 = local_48 * 4;
        if (local_2a.nVars != 1) {
          uVar10 = uVar5;
        }
        uVar10 = uVar10 | local_48;
        uVar6 = 2;
        if (2 < (uint)(int)local_2a.nVars) {
          uVar6 = (int)local_2a.nVars;
        }
        uVar9 = uVar10 << 4;
        if (2U < (byte)local_2a.nVars) {
          uVar9 = uVar5;
        }
        uVar8 = 3;
        if (2U < (byte)local_2a.nVars) {
          uVar8 = uVar6;
        }
        uVar9 = uVar9 | uVar10;
        uVar7 = uVar9 << 8;
        if (uVar8 != 3) {
          uVar7 = uVar5;
        }
        uVar7 = uVar7 | uVar9;
        uVar10 = uVar7 << 0x10;
        if (1 < uVar8 - 3) {
          uVar10 = uVar5;
        }
        if ((byte)local_2a.nVars < 5) {
          return 1;
        }
        uVar10 = uVar10 | uVar7;
        uVar10 = uVar10 << 0x20 | uVar10;
      }
      pIVar1 = p->pPars;
      if ((pIVar1->fEnableCheck75 != 0) && (iVar2 = If_CluCheckDecOut(uVar10,5), iVar2 != 0)) {
        return 1;
      }
      if (pIVar1->fEnableCheck75u == 0) {
        return 0;
      }
      lVar3 = 0;
      while( true ) {
        if ((uVar10 & ~*(ulong *)((long)Truth6 + lVar3)) == 0) {
          return 1;
        }
        if ((*(ulong *)((long)Truth6 + lVar3) | uVar10) == 0xffffffffffffffff) break;
        lVar3 = lVar3 + 8;
        if (lVar3 == 0x28) {
          return 0;
        }
      }
      return 1;
    }
  }
  __assert_fail("nVars >= 0 && nVars <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                ,0x174,"word If_CluAdjust(word, int)");
}

Assistant:

int If_CutPerformCheck45( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{    
    // 5LUT -> 4LUT
    If_Grp_t G, R;
    word Func0, Func1;
    G = If_CluCheck( p, (word *)pTruth, nLeaves, 0, 0, 5, 4, &R, &Func0, &Func1, NULL, 0 );
    if ( G.nVars == 0 )
        return 0;
    Func0 = If_CluAdjust( Func0, R.nVars );
    Func1 = If_CluAdjust( Func1, G.nVars );
#if 0
    Kit_DsdPrintFromTruth( pTruth, nVars ); printf( "\n" );
    Kit_DsdPrintFromTruth( (unsigned*)&Func0, R.nVars ); printf( "\n" );
    Kit_DsdPrintFromTruth( (unsigned*)&Func1, G.nVars ); printf( "\n" );
    If_CluPrintGroup( &R );
    If_CluPrintGroup( &G );
#endif
    if ( G.nVars < 5 || (p->pPars->fEnableCheck75 && If_CluCheckDecOut(Func1, 5)) || (p->pPars->fEnableCheck75u && If_CluCheckDecOutU(Func1, 5)) )
        return 1;
    return 0;
}